

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O3

string * __thiscall
leveldb::log::LogTest::Read_abi_cxx11_(string *__return_storage_ptr__,LogTest *this)

{
  size_type sVar1;
  bool bVar2;
  Slice record;
  string scratch;
  Slice local_40;
  string local_30;
  
  if (this->reading_ == false) {
    this->reading_ = true;
    sVar1 = (this->dest_).contents_._M_string_length;
    (this->source_).contents_.data_ = (this->dest_).contents_._M_dataplus._M_p;
    (this->source_).contents_.size_ = sVar1;
  }
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_40.data_ = "";
  local_40.size_ = 0;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bVar2 = Reader::ReadRecord(this->reader_,&local_40,&local_30);
  if (bVar2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_40.data_,local_40.data_ + local_40.size_);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"EOF","");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Read() {
    if (!reading_) {
      reading_ = true;
      source_.contents_ = Slice(dest_.contents_);
    }
    std::string scratch;
    Slice record;
    if (reader_->ReadRecord(&record, &scratch)) {
      return record.ToString();
    } else {
      return "EOF";
    }
  }